

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ConvertModel
          (FBXConverter *this,Model *model,aiNode *nd,aiMatrix4x4 *node_global_transform)

{
  undefined1 auVar1 [16];
  pointer this_00;
  bool bVar2;
  size_type sVar3;
  reference ppGVar4;
  string *__rhs;
  ulong __n;
  uint *__s;
  iterator __first1;
  iterator __last1;
  LineGeometry *local_2e0;
  LineGeometry *local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  format local_280;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_100;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_f8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_c0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices;
  LineGeometry *line;
  MeshGeometry *mesh;
  Geometry *geo;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_> *__range2;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshes;
  vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_> *geos;
  aiMatrix4x4 *node_global_transform_local;
  aiNode *nd_local;
  Model *model_local;
  FBXConverter *this_local;
  
  meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)Model::GetGeometry(model);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  sVar3 = std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
          ::size((vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                  *)meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,sVar3);
  this_00 = meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  __end2 = std::
           vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>::
           begin((vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                  *)meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  geo = (Geometry *)
        std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>::
        end((vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_> *
            )this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Assimp::FBX::Geometry_*const_*,_std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>_>
                                     *)&geo), bVar2) {
    ppGVar4 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Geometry_*const_*,_std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>_>
              ::operator*(&__end2);
    mesh = (MeshGeometry *)*ppGVar4;
    if (mesh == (MeshGeometry *)0x0) {
      local_2d0 = (LineGeometry *)0x0;
    }
    else {
      local_2d0 = (LineGeometry *)__dynamic_cast(mesh,&Geometry::typeinfo,&MeshGeometry::typeinfo,0)
      ;
    }
    line = local_2d0;
    if (mesh == (MeshGeometry *)0x0) {
      local_2e0 = (LineGeometry *)0x0;
    }
    else {
      local_2e0 = (LineGeometry *)__dynamic_cast(mesh,&Geometry::typeinfo,&LineGeometry::typeinfo,0)
      ;
    }
    indices = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e0;
    if (line == (LineGeometry *)0x0) {
      if (local_2e0 == (LineGeometry *)0x0) {
        __rhs = FBX::Object::Name_abi_cxx11_((Object *)mesh);
        std::operator+(&local_2a0,"ignoring unrecognized geometry: ",__rhs);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_280,
                   &local_2a0);
        LogFunctions<Assimp::FBXImporter>::LogWarn(&local_280);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_280);
        std::__cxx11::string::~string((string *)&local_2a0);
      }
      else {
        ConvertLine(&local_e8,this,local_2e0,model,node_global_transform,nd);
        local_d0 = &local_e8;
        local_f0._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(local_d0);
        local_f8._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(local_d0);
        local_100 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
        local_108 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    std::
                    copy<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                              (local_f0,local_f8,
                               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                )local_100);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e8);
      }
    }
    else {
      ConvertMesh(&local_a8,this,(MeshGeometry *)line,model,node_global_transform,nd);
      local_90 = &local_a8;
      local_b0._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(local_90);
      local_b8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(local_90);
      local_c0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
      indices_1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                            (local_b0,local_b8,
                             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )local_c0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a8);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::Geometry_*const_*,_std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>_>
    ::operator++(&__end2);
  }
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  if (sVar3 != 0) {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    __n = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      __n = 0xffffffffffffffff;
    }
    __s = (uint *)operator_new__(__n);
    memset(__s,0,__n);
    nd->mMeshes = __s;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    nd->mNumMeshes = (uint)sVar3;
    __first1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    __last1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    std::
    swap_ranges<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int*>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__first1._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__last1._M_current,nd->mMeshes);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  return;
}

Assistant:

void FBXConverter::ConvertModel(const Model& model, aiNode& nd, const aiMatrix4x4& node_global_transform)
        {
            const std::vector<const Geometry*>& geos = model.GetGeometry();

            std::vector<unsigned int> meshes;
            meshes.reserve(geos.size());

            for (const Geometry* geo : geos) {

                const MeshGeometry* const mesh = dynamic_cast<const MeshGeometry*>(geo);
                const LineGeometry* const line = dynamic_cast<const LineGeometry*>(geo);
                if (mesh) {
                    const std::vector<unsigned int>& indices = ConvertMesh(*mesh, model, node_global_transform, nd);
                    std::copy(indices.begin(), indices.end(), std::back_inserter(meshes));
                }
                else if (line) {
                    const std::vector<unsigned int>& indices = ConvertLine(*line, model, node_global_transform, nd);
                    std::copy(indices.begin(), indices.end(), std::back_inserter(meshes));
                }
                else {
                    FBXImporter::LogWarn("ignoring unrecognized geometry: " + geo->Name());
                }
            }

            if (meshes.size()) {
                nd.mMeshes = new unsigned int[meshes.size()]();
                nd.mNumMeshes = static_cast<unsigned int>(meshes.size());

                std::swap_ranges(meshes.begin(), meshes.end(), nd.mMeshes);
            }
        }